

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTime.c
# Opt level: O0

void If_CutSortInputPins(If_Man_t *p,If_Cut_t *pCut,int *pPinPerm,float *pPinDelays)

{
  int iVar1;
  If_Cut_t *pIVar2;
  bool bVar3;
  int local_3c;
  int temp;
  int best_i;
  int j;
  int i;
  If_Obj_t *pLeaf;
  float *pPinDelays_local;
  int *pPinPerm_local;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  best_i = 0;
  while( true ) {
    bVar3 = false;
    if (best_i < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
      _j = If_ManObj(p,(int)(&pCut[1].Area)[best_i]);
      bVar3 = _j != (If_Obj_t *)0x0;
    }
    if (!bVar3) break;
    pPinPerm[best_i] = best_i;
    pIVar2 = If_ObjCutBest(_j);
    pPinDelays[best_i] = pIVar2->Delay;
    best_i = best_i + 1;
  }
  for (best_i = 0; best_i < (int)((*(uint *)&pCut->field_0x1c >> 0x18) - 1); best_i = best_i + 1) {
    local_3c = best_i;
    temp = best_i;
    while (temp = temp + 1, temp < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
      if (pPinDelays[pPinPerm[local_3c]] <= pPinDelays[pPinPerm[temp]] &&
          pPinDelays[pPinPerm[temp]] != pPinDelays[pPinPerm[local_3c]]) {
        local_3c = temp;
      }
    }
    if (local_3c != best_i) {
      iVar1 = pPinPerm[best_i];
      pPinPerm[best_i] = pPinPerm[local_3c];
      pPinPerm[local_3c] = iVar1;
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Sorts the pins in the decreasing order of delays.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void If_CutSortInputPins( If_Man_t * p, If_Cut_t * pCut, int * pPinPerm, float * pPinDelays )
{
    If_Obj_t * pLeaf;
    int i, j, best_i, temp;
    // start the trivial permutation and collect pin delays
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        pPinPerm[i] = i;
        pPinDelays[i] = If_ObjCutBest(pLeaf)->Delay;
    }
    // selection sort the pins in the decreasible order of delays
    // this order will match the increasing order of LUT input pins
    for ( i = 0; i < (int)pCut->nLeaves-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < (int)pCut->nLeaves; j++ )
            if ( pPinDelays[pPinPerm[j]] > pPinDelays[pPinPerm[best_i]] )
                best_i = j;
        if ( best_i == i )
            continue;
        temp = pPinPerm[i]; 
        pPinPerm[i] = pPinPerm[best_i]; 
        pPinPerm[best_i] = temp;
    }
/*
    // verify
    assert( pPinPerm[0] < (int)pCut->nLeaves );
    for ( i = 1; i < (int)pCut->nLeaves; i++ )
    {
        assert( pPinPerm[i] < (int)pCut->nLeaves );
        assert( pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]] );
    }
*/
}